

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::parseFractionStem
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  FractionSignificantSettings FVar1;
  char16_t cVar2;
  int32_t iVar3;
  int minFractionPlaces;
  int maxFractionPlaces;
  int index;
  Precision local_50;
  
  index = 1;
  while ((iVar3 = numparse::impl::StringSegment::length(segment), index < iVar3 &&
         (cVar2 = numparse::impl::StringSegment::charAt(segment,index), cVar2 == L'0'))) {
    index = index + 1;
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  minFractionPlaces = index + -1;
  maxFractionPlaces = minFractionPlaces;
  if (index < iVar3) {
    cVar2 = numparse::impl::StringSegment::charAt(segment,index);
    if (cVar2 == L'+') {
      index = index + 1;
      maxFractionPlaces = -1;
    }
    else {
      while ((iVar3 = numparse::impl::StringSegment::length(segment), index < iVar3 &&
             (cVar2 = numparse::impl::StringSegment::charAt(segment,index), cVar2 == L'#'))) {
        index = index + 1;
      }
      maxFractionPlaces = index + -1;
    }
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  if (index < iVar3) {
    *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  else {
    if (maxFractionPlaces == -1) {
      Precision::minFraction((FractionPrecision *)&local_50,minFractionPlaces);
    }
    else {
      Precision::minMaxFraction(minFractionPlaces,maxFractionPlaces);
    }
    FVar1.fMinSig = local_50.fUnion.fracSig.fMinSig;
    FVar1.fMaxSig = local_50.fUnion.fracSig.fMaxSig;
    FVar1.fMinFrac = local_50.fUnion.fracSig.fMinFrac;
    FVar1.fMaxFrac = local_50.fUnion.fracSig.fMaxFrac;
    *(ulong *)((long)&(macros->precision).fUnion.increment.fIncrement + 4) =
         CONCAT44(local_50.fUnion._8_4_,local_50.fUnion._4_4_);
    *(undefined8 *)((long)&(macros->precision).fUnion + 0xc) = local_50._20_8_;
    (macros->precision).fType = local_50.fType;
    *(undefined4 *)&(macros->precision).field_0x4 = local_50._4_4_;
    (macros->precision).fUnion.fracSig = FVar1;
  }
  return;
}

Assistant:

void blueprint_helpers::parseFractionStem(const StringSegment& segment, MacroProps& macros,
                                          UErrorCode& status) {
    U_ASSERT(segment.charAt(0) == u'.');
    int32_t offset = 1;
    int32_t minFrac = 0;
    int32_t maxFrac;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'0') {
            minFrac++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        if (segment.charAt(offset) == u'+') {
            maxFrac = -1;
            offset++;
        } else {
            maxFrac = minFrac;
            for (; offset < segment.length(); offset++) {
                if (segment.charAt(offset) == u'#') {
                    maxFrac++;
                } else {
                    break;
                }
            }
        }
    } else {
        maxFrac = minFrac;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid fraction stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Use the public APIs to enforce bounds checking
    if (maxFrac == -1) {
        macros.precision = Precision::minFraction(minFrac);
    } else {
        macros.precision = Precision::minMaxFraction(minFrac, maxFrac);
    }
}